

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  char *name;
  ostream *poVar1;
  allocator local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  string srcdir;
  cmGeneratedFileStream fout;
  string local_30 [8];
  string fname;
  LaunchHelper *this_local;
  
  fname.field_2._8_8_ = this;
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  std::__cxx11::string::string(local_30,(string *)&this->Handler->CTestLaunchDir);
  std::__cxx11::string::operator+=(local_30,"/CTestLaunchConfig.cmake");
  name = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&srcdir.field_2 + 8),name,false);
  this_00 = this->CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"SourceDirectory",&local_2c9);
  cmCTest::GetCTestConfiguration((string *)local_2a8,this_00,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  poVar1 = std::operator<<((ostream *)((long)&srcdir.field_2 + 8),"set(CTEST_SOURCE_DIRECTORY \"");
  poVar1 = std::operator<<(poVar1,(string *)local_2a8);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)local_2a8);
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&srcdir.field_2 + 8));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname = this->Handler->CTestLaunchDir;
  fname += "/CTestLaunchConfig.cmake";
  cmGeneratedFileStream fout(fname.c_str());
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}